

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv_bld.cpp
# Opt level: O0

UConverterSharedData * getAlgorithmicTypeFromName(char *realName)

{
  uint uVar1;
  uint uVar2;
  char local_68 [8];
  char strippedName [60];
  int result;
  uint32_t lastMid;
  uint32_t limit;
  uint32_t start;
  uint32_t mid;
  char *realName_local;
  
  ucnv_io_stripASCIIForCompare_63(local_68,realName);
  lastMid = 0;
  result = 0x22;
  strippedName[0x38] = -1;
  strippedName[0x39] = -1;
  strippedName[0x3a] = -1;
  strippedName[0x3b] = -1;
  uVar1 = result;
  do {
    result = uVar1;
    uVar2 = lastMid + result >> 1;
    if (strippedName._56_4_ == uVar2) {
      return (UConverterSharedData *)0x0;
    }
    strippedName._56_4_ = uVar2;
    strippedName._52_4_ = strcmp(local_68,cnvNameType[uVar2].name);
    uVar1 = uVar2;
  } while (((int)strippedName._52_4_ < 0) ||
          (uVar1 = result, lastMid = uVar2, 0 < (int)strippedName._52_4_));
  return converterData[cnvNameType[uVar2].type];
}

Assistant:

static const UConverterSharedData *
getAlgorithmicTypeFromName(const char *realName)
{
    uint32_t mid, start, limit;
    uint32_t lastMid;
    int result;
    char strippedName[UCNV_MAX_CONVERTER_NAME_LENGTH];

    /* Lower case and remove ignoreable characters. */
    ucnv_io_stripForCompare(strippedName, realName);

    /* do a binary search for the alias */
    start = 0;
    limit = UPRV_LENGTHOF(cnvNameType);
    mid = limit;
    lastMid = UINT32_MAX;

    for (;;) {
        mid = (uint32_t)((start + limit) / 2);
        if (lastMid == mid) {   /* Have we moved? */
            break;  /* We haven't moved, and it wasn't found. */
        }
        lastMid = mid;
        result = uprv_strcmp(strippedName, cnvNameType[mid].name);

        if (result < 0) {
            limit = mid;
        } else if (result > 0) {
            start = mid;
        } else {
            return converterData[cnvNameType[mid].type];
        }
    }

    return NULL;
}